

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_compact.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::CompactData::getUniquePatterns
          (CompactData *this,UVector *output,UErrorCode *status)

{
  UChar *s1;
  int32_t iVar1;
  UChar *s2;
  int index;
  long lVar2;
  
  lVar2 = 8;
  do {
    s1 = *(UChar **)((long)this->patterns + lVar2 + -8);
    if (s1 != L"<USE FALLBACK>" && s1 != (UChar *)0x0) {
      index = output->count;
      do {
        if (index < 1) {
          UVector::addElement(output,s1,status);
          break;
        }
        index = index + -1;
        s2 = (UChar *)UVector::elementAt(output,index);
        iVar1 = u_strcmp_63(s1,s2);
      } while (iVar1 != 0);
    }
    lVar2 = lVar2 + 8;
    if (lVar2 == 0x308) {
      return;
    }
  } while( true );
}

Assistant:

void CompactData::getUniquePatterns(UVector &output, UErrorCode &status) const {
    U_ASSERT(output.isEmpty());
    // NOTE: In C++, this is done more manually with a UVector.
    // In Java, we can take advantage of JDK HashSet.
    for (auto pattern : patterns) {
        if (pattern == nullptr || pattern == USE_FALLBACK) {
            continue;
        }

        // Insert pattern into the UVector if the UVector does not already contain the pattern.
        // Search the UVector from the end since identical patterns are likely to be adjacent.
        for (int32_t i = output.size() - 1; i >= 0; i--) {
            if (u_strcmp(pattern, static_cast<const UChar *>(output[i])) == 0) {
                goto continue_outer;
            }
        }

        // The string was not found; add it to the UVector.
        // ANDY: This requires a const_cast.  Why?
        output.addElement(const_cast<UChar *>(pattern), status);

        continue_outer:
        continue;
    }
}